

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void __thiscall tcmalloc::ThreadCache::ThreadCache(ThreadCache *this)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  SizeMap *this_00;
  ulong uVar4;
  uintptr_t addr;
  uintptr_t sampler_seed;
  ThreadCache *pTStack_30;
  uint32_t cl;
  size_t min_size;
  ThreadCache *this_local;
  memory_order local_18;
  undefined4 local_14;
  memory_order __b;
  
  min_size = (size_t)this;
  Sampler::Sampler(&this->sampler_);
  this->size_ = 0;
  this->max_size_ = 0;
  IncreaseCacheLimitLocked(this);
  if (this->max_size_ == 0) {
    ___b = &min_per_thread_cache_size_;
    local_14 = 0;
    local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
    this_local = min_per_thread_cache_size_;
    pTStack_30 = min_per_thread_cache_size_;
    SetMaxSize(this,(int32_t)min_per_thread_cache_size_);
    unclaimed_cache_space_ = unclaimed_cache_space_ - (long)pTStack_30;
  }
  this->next_ = (ThreadCache *)0x0;
  this->prev_ = (ThreadCache *)0x0;
  for (sampler_seed._4_4_ = 0; uVar1 = sampler_seed._4_4_, uVar2 = Static::num_size_classes(),
      uVar1 < uVar2; sampler_seed._4_4_ = sampler_seed._4_4_ + 1) {
    uVar4 = (ulong)sampler_seed._4_4_;
    this_00 = Static::sizemap();
    iVar3 = SizeMap::class_to_size(this_00,sampler_seed._4_4_);
    FreeList::Init(this->list_ + uVar4,(long)iVar3);
  }
  addr = (uintptr_t)&addr;
  Sampler::Init(&this->sampler_,addr);
  return;
}

Assistant:

ThreadCache::ThreadCache() {
  ASSERT(Static::pageheap_lock()->IsHeld());

  size_ = 0;

  max_size_ = 0;
  IncreaseCacheLimitLocked();
  if (max_size_ == 0) {
    // There isn't enough memory to go around.  Just give the minimum to
    // this thread.
    size_t min_size = min_per_thread_cache_size_.load(std::memory_order_relaxed);
    SetMaxSize(min_size);

    // Take unclaimed_cache_space_ negative.
    unclaimed_cache_space_ -= min_size;
    ASSERT(unclaimed_cache_space_ < 0);
  }

  next_ = nullptr;
  prev_ = nullptr;
  for (uint32_t cl = 0; cl < Static::num_size_classes(); ++cl) {
    list_[cl].Init(Static::sizemap()->class_to_size(cl));
  }

  uintptr_t sampler_seed;
  uintptr_t addr = reinterpret_cast<uintptr_t>(&sampler_seed);
  sampler_seed = addr;

  sampler_.Init(uint64_t{sampler_seed});
}